

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  ShaderType SVar2;
  TestContext *pTVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  char *pcVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  char *pcVar9;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  undefined1 local_a30 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  testCase_4;
  undefined1 local_a18 [6];
  bool isVertexCase_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  undefined1 local_958 [8];
  string desc_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  undefined1 local_870 [8];
  string name_4;
  char *shaderTypeName_3;
  ShaderType shaderType_3;
  int shaderTypeNdx_3;
  char *readAccessName_3;
  char *writeAccessName_2;
  IndexAccessType local_828;
  int readAccess_3;
  int writeAccess_2;
  DataType varType_4;
  int typeNdx_4;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> matGroup;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  undefined1 local_7b8 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  testCase_3;
  undefined1 local_7a0 [6];
  bool isVertexCase_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  undefined1 local_6e0 [8];
  string desc_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  string name_3;
  char *shaderTypeName_2;
  ShaderType shaderType_2;
  int shaderTypeNdx_2;
  char *readAccessName_2;
  char *writeAccessName_1;
  VectorAccessType local_5b0;
  int readAccess_2;
  int writeAccess_1;
  DataType varType_3;
  int typeNdx_3;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> vecGroup;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  testCase_2;
  undefined1 local_578 [6];
  bool isVertexCase_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  string desc_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  undefined1 local_3d0 [8];
  string name_2;
  char *shaderTypeName_1;
  ShaderType shaderType_1;
  int shaderTypeNdx_1;
  char *readAccessName_1;
  char *writeAccessName;
  IndexAccessType local_388;
  int readAccess_1;
  int writeAccess;
  DataType varType_2;
  int typeNdx_2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> tmpGroup;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  testCase_1;
  undefined1 local_350 [6];
  bool isVertexCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string desc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string name_1;
  char *shaderTypeName;
  ShaderType shaderType;
  int shaderTypeNdx;
  char *readAccessName;
  int readAccess;
  DataType varType_1;
  int typeNdx_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> uniformGroup;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
  testCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string name;
  char *fragAccessName;
  char *vertAccessName;
  int fragAccess;
  int vertAccess;
  DataType varType;
  int typeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> varyingGroup;
  ShaderIndexingTests *this_local;
  
  varyingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = this;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"varying_array",
             "Varying array access tests.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&varType + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar4
            );
  for (vertAccess = 0; vertAccess < 4; vertAccess = vertAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[vertAccess];
    for (vertAccessName._4_4_ = INDEXACCESS_STATIC; (int)vertAccessName._4_4_ < 4;
        vertAccessName._4_4_ = vertAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
      for (vertAccessName._0_4_ = INDEXACCESS_STATIC; (int)(IndexAccessType)vertAccessName < 4;
          vertAccessName._0_4_ = (IndexAccessType)vertAccessName + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(vertAccessName._4_4_);
        name.field_2._8_8_ = getIndexAccessTypeName((IndexAccessType)vertAccessName);
        pcVar6 = glu::getDataTypeName(DVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,pcVar6,(allocator<char> *)(desc.field_2._M_local_buf + 0xf))
        ;
        std::operator+(&local_f0,&local_110,"_");
        std::operator+(&local_d0,&local_f0,pcVar5);
        std::operator+(&local_b0,&local_d0,"_write_");
        std::operator+(&local_90,&local_b0,(char *)name.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,&local_90,"_read");
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"Varying array with ",
                   (allocator<char> *)
                   &testCase.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    .m_data.field_0xf);
        std::operator+(&local_198,&local_1b8,pcVar5);
        std::operator+(&local_178,&local_198," write in vertex shader and ");
        std::operator+(&local_158,&local_178,(char *)name.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_158," read in fragment shader.");
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testCase.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    .m_data.field_0xf);
        createVaryingArrayCase
                  ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    *)&uniformGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   (string *)local_70,(string *)local_138,DVar1,vertAccessName._4_4_,
                   (IndexAccessType)vertAccessName);
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_20)->super_TestNode;
        pTVar8 = (TestNode *)
                 de::details::
                 MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                 ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                            *)&uniformGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data.field_0x8);
        tcu::TestNode::addChild(pTVar7,pTVar8);
        de::details::
        MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
        ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    *)&uniformGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8);
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20
                   )->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"uniform_array",
             "Uniform array access tests.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&varType_1 + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_1,
             pTVar4);
  for (readAccess = 0; readAccess < 4; readAccess = readAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[readAccess];
    for (readAccessName._0_4_ = INDEXACCESS_STATIC; (int)(IndexAccessType)readAccessName < 4;
        readAccessName._0_4_ = (IndexAccessType)readAccessName + INDEXACCESS_DYNAMIC) {
      pcVar5 = getIndexAccessTypeName((IndexAccessType)readAccessName);
      for (shaderTypeName._4_4_ = 0; shaderTypeName._4_4_ < 2;
          shaderTypeName._4_4_ = shaderTypeName._4_4_ + 1) {
        SVar2 = init::s_shaderTypes[shaderTypeName._4_4_];
        name_1.field_2._8_8_ = glu::getShaderTypeName(SVar2);
        pcVar6 = glu::getDataTypeName(DVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,pcVar6,
                   (allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::operator+(&local_288,&local_2a8,"_");
        std::operator+(&local_268,&local_288,pcVar5);
        std::operator+(&local_248,&local_268,"_read_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,&local_248,(char *)name_1.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator((allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_350,"Uniform array with ",
                   (allocator<char> *)
                   &testCase_1.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    .m_data.field_0xf);
        std::operator+(&local_330,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_350,pcVar5);
        std::operator+(&local_310,&local_330," read in ");
        std::operator+(&local_2f0,&local_310,(char *)name_1.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d0,&local_2f0," shader.");
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_350);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testCase_1.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    .m_data.field_0xf);
        testCase_1.
        super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
        .m_data._14_1_ = SVar2 == SHADERTYPE_VERTEX;
        createUniformArrayCase
                  ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    *)&tmpGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   (string *)local_228,(string *)local_2d0,
                   (bool)testCase_1.
                         super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                         .m_data._14_1_,DVar1,(IndexAccessType)readAccessName);
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&typeNdx_1)->super_TestNode;
        pTVar8 = (TestNode *)
                 de::details::
                 MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                 ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                            *)&tmpGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data.field_0x8);
        tcu::TestNode::addChild(pTVar7,pTVar8);
        de::details::
        MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
        ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                    *)&tmpGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8);
        std::__cxx11::string::~string((string *)local_2d0);
        std::__cxx11::string::~string((string *)local_228);
      }
    }
  }
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &typeNdx_1)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_1);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"tmp_array",
             "Temporary array access tests.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&varType_2 + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_2,
             pTVar4);
  for (writeAccess = 0; writeAccess < 4; writeAccess = writeAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[writeAccess];
    for (local_388 = INDEXACCESS_STATIC; (int)local_388 < 4;
        local_388 = local_388 + INDEXACCESS_DYNAMIC) {
      for (writeAccessName._4_4_ = INDEXACCESS_STATIC; (int)writeAccessName._4_4_ < 4;
          writeAccessName._4_4_ = writeAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(local_388);
        pcVar6 = getIndexAccessTypeName(writeAccessName._4_4_);
        for (shaderTypeName_1._4_4_ = 0; shaderTypeName_1._4_4_ < 2;
            shaderTypeName_1._4_4_ = shaderTypeName_1._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_1._4_4_];
          name_2.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar9 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_490,pcVar9,
                     (allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::operator+(&local_470,&local_490,"_");
          std::operator+(&local_450,&local_470,pcVar5);
          std::operator+(&local_430,&local_450,"_write_");
          std::operator+(&local_410,&local_430,pcVar6);
          std::operator+(&local_3f0,&local_410,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3d0,&local_3f0,(char *)name_2.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator((allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_578,"Temporary array with ",
                     (allocator<char> *)
                     &testCase_2.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          std::operator+(&local_558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_578,pcVar5);
          std::operator+(&local_538,&local_558," write and ");
          std::operator+(&local_518,&local_538,pcVar6);
          std::operator+(&local_4f8,&local_518," read in ");
          std::operator+(&local_4d8,&local_4f8,(char *)name_2.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b8,&local_4d8," shader.");
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)local_578);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &testCase_2.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          testCase_2.
          super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          .m_data._14_1_ = SVar2 == SHADERTYPE_VERTEX;
          createTmpArrayCase((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                              *)&vecGroup.
                                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                 .m_data.field_0x8,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,
                             (string *)local_3d0,(string *)local_4b8,
                             (bool)testCase_2.
                                   super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                                   .m_data._14_1_,DVar1,local_388,writeAccessName._4_4_);
          pTVar7 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&typeNdx_2)->super_TestNode;
          pTVar8 = (TestNode *)
                   de::details::
                   MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                   ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                              *)&vecGroup.
                                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                 .m_data.field_0x8);
          tcu::TestNode::addChild(pTVar7,pTVar8);
          de::details::
          MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      *)&vecGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data.field_0x8);
          std::__cxx11::string::~string((string *)local_4b8);
          std::__cxx11::string::~string((string *)local_3d0);
        }
      }
    }
  }
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &typeNdx_2)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_2);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"vector_subscript",
             "Vector subscript indexing.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&varType_3 + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_3,
             pTVar4);
  for (writeAccess_1 = 0; writeAccess_1 < 3; writeAccess_1 = writeAccess_1 + 1) {
    DVar1 = init::s_vectorTypes[writeAccess_1];
    for (local_5b0 = DIRECT; (int)local_5b0 < 6; local_5b0 = local_5b0 + COMPONENT) {
      for (writeAccessName_1._4_4_ = DIRECT; (int)writeAccessName_1._4_4_ < 6;
          writeAccessName_1._4_4_ = writeAccessName_1._4_4_ + COMPONENT) {
        pcVar5 = getVectorAccessTypeName(local_5b0);
        pcVar6 = getVectorAccessTypeName(writeAccessName_1._4_4_);
        for (shaderTypeName_2._4_4_ = 0; shaderTypeName_2._4_4_ < 2;
            shaderTypeName_2._4_4_ = shaderTypeName_2._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_2._4_4_];
          name_3.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar9 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6b8,pcVar9,
                     (allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::operator+(&local_698,&local_6b8,"_");
          std::operator+(&local_678,&local_698,pcVar5);
          std::operator+(&local_658,&local_678,"_write_");
          std::operator+(&local_638,&local_658,pcVar6);
          std::operator+(&local_618,&local_638,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5f8,&local_618,(char *)name_3.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::string::~string((string *)&local_678);
          std::__cxx11::string::~string((string *)&local_698);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::allocator<char>::~allocator((allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_7a0,"Vector subscript access with ",
                     (allocator<char> *)
                     &testCase_3.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          std::operator+(&local_780,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7a0,pcVar5);
          std::operator+(&local_760,&local_780," write and ");
          std::operator+(&local_740,&local_760,pcVar6);
          std::operator+(&local_720,&local_740," read in ");
          std::operator+(&local_700,&local_720,(char *)name_3.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6e0,&local_700," shader.");
          std::__cxx11::string::~string((string *)&local_700);
          std::__cxx11::string::~string((string *)&local_720);
          std::__cxx11::string::~string((string *)&local_740);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_780);
          std::__cxx11::string::~string((string *)local_7a0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &testCase_3.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          testCase_3.
          super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          .m_data._14_1_ = SVar2 == SHADERTYPE_VERTEX;
          pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,pcVar9,&local_7d9)
          ;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_800,pcVar9,
                     (allocator<char> *)
                     &matGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.field_0xf);
          createVectorSubscriptCase
                    ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      *)local_7b8,pTVar3,&local_7d8,&local_800,
                     (bool)(testCase_3.
                            super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                            .m_data._14_1_ & 1),DVar1,local_5b0,writeAccessName_1._4_4_);
          std::__cxx11::string::~string((string *)&local_800);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &matGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.field_0xf);
          std::__cxx11::string::~string((string *)&local_7d8);
          std::allocator<char>::~allocator(&local_7d9);
          pTVar7 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&typeNdx_3)->super_TestNode;
          pTVar8 = (TestNode *)
                   de::details::
                   MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                   ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                              *)local_7b8);
          tcu::TestNode::addChild(pTVar7,pTVar8);
          de::details::
          MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      *)local_7b8);
          std::__cxx11::string::~string((string *)local_6e0);
          std::__cxx11::string::~string((string *)local_5f8);
        }
      }
    }
  }
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &typeNdx_3)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_3);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"matrix_subscript",
             "Matrix subscript indexing.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&varType_4 + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_4,
             pTVar4);
  for (writeAccess_2 = 0; writeAccess_2 < 9; writeAccess_2 = writeAccess_2 + 1) {
    DVar1 = init::s_matrixTypes[writeAccess_2];
    for (local_828 = INDEXACCESS_STATIC; (int)local_828 < 4;
        local_828 = local_828 + INDEXACCESS_DYNAMIC) {
      for (writeAccessName_2._4_4_ = INDEXACCESS_STATIC; (int)writeAccessName_2._4_4_ < 4;
          writeAccessName_2._4_4_ = writeAccessName_2._4_4_ + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(local_828);
        pcVar6 = getIndexAccessTypeName(writeAccessName_2._4_4_);
        for (shaderTypeName_3._4_4_ = 0; shaderTypeName_3._4_4_ < 2;
            shaderTypeName_3._4_4_ = shaderTypeName_3._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_3._4_4_];
          name_4.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar9 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_930,pcVar9,
                     (allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::operator+(&local_910,&local_930,"_");
          std::operator+(&local_8f0,&local_910,pcVar5);
          std::operator+(&local_8d0,&local_8f0,"_write_");
          std::operator+(&local_8b0,&local_8d0,pcVar6);
          std::operator+(&local_890,&local_8b0,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_870,&local_890,(char *)name_4.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_890);
          std::__cxx11::string::~string((string *)&local_8b0);
          std::__cxx11::string::~string((string *)&local_8d0);
          std::__cxx11::string::~string((string *)&local_8f0);
          std::__cxx11::string::~string((string *)&local_910);
          std::__cxx11::string::~string((string *)&local_930);
          std::allocator<char>::~allocator((allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a18,"Vector subscript access with ",
                     (allocator<char> *)
                     &testCase_4.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          std::operator+(&local_9f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a18,pcVar5);
          std::operator+(&local_9d8,&local_9f8," write and ");
          std::operator+(&local_9b8,&local_9d8,pcVar6);
          std::operator+(&local_998,&local_9b8," read in ");
          std::operator+(&local_978,&local_998,(char *)name_4.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_958,&local_978," shader.");
          std::__cxx11::string::~string((string *)&local_978);
          std::__cxx11::string::~string((string *)&local_998);
          std::__cxx11::string::~string((string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9d8);
          std::__cxx11::string::~string((string *)&local_9f8);
          std::__cxx11::string::~string((string *)local_a18);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &testCase_4.
                      super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      .m_data.field_0xf);
          testCase_4.
          super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          .m_data._14_1_ = SVar2 == SHADERTYPE_VERTEX;
          pTVar3 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a50,pcVar9,&local_a51)
          ;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,pcVar9,&local_a79)
          ;
          createMatrixSubscriptCase
                    ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      *)local_a30,pTVar3,&local_a50,&local_a78,
                     (bool)(testCase_4.
                            super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                            .m_data._14_1_ & 1),DVar1,local_828,writeAccessName_2._4_4_);
          std::__cxx11::string::~string((string *)&local_a78);
          std::allocator<char>::~allocator(&local_a79);
          std::__cxx11::string::~string((string *)&local_a50);
          std::allocator<char>::~allocator(&local_a51);
          pTVar7 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&typeNdx_4)->super_TestNode;
          pTVar8 = (TestNode *)
                   de::details::
                   MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                   ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                              *)local_a30);
          tcu::TestNode::addChild(pTVar7,pTVar8);
          de::details::
          MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
          ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderIndexingCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderIndexingCase>_>
                      *)local_a30);
          std::__cxx11::string::~string((string *)local_958);
          std::__cxx11::string::~string((string *)local_870);
        }
      }
    }
  }
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &typeNdx_4)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&typeNdx_4);
  return extraout_EAX;
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		de::MovePtr<TestCaseGroup> varyingGroup(new TestCaseGroup(m_testCtx, "varying_array", "Varying array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					de::MovePtr<ShaderIndexingCase> testCase(createVaryingArrayCase(m_testCtx, name, desc, varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
					varyingGroup->addChild(testCase.release());
				}
			}
		}

		addChild(varyingGroup.release());
	}

	// Uniform array access cases.
	{
		de::MovePtr<TestCaseGroup> uniformGroup(new TestCaseGroup(m_testCtx, "uniform_array", "Uniform array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					de::MovePtr<ShaderIndexingCase> testCase(createUniformArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)readAccess));
					uniformGroup->addChild(testCase.release());
				}
			}
		}

		addChild(uniformGroup.release());
	}

	// Temporary array access cases.
	{
		de::MovePtr<TestCaseGroup> tmpGroup(new TestCaseGroup(m_testCtx, "tmp_array", "Temporary array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createTmpArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						tmpGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(tmpGroup.release());
	}

	// Vector indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> vecGroup(new TestCaseGroup(m_testCtx, "vector_subscript", "Vector subscript indexing."));

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createVectorSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
						vecGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(vecGroup.release());
	}

	// Matrix indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> matGroup(new TestCaseGroup(m_testCtx, "matrix_subscript", "Matrix subscript indexing."));

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT2X3,
			TYPE_FLOAT_MAT2X4,
			TYPE_FLOAT_MAT3X2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT3X4,
			TYPE_FLOAT_MAT4X2,
			TYPE_FLOAT_MAT4X3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createMatrixSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						matGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(matGroup.release());
	}
}